

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O1

bool dxil_spv::emit_cbuffer_load_legacy_instruction(Impl *impl,CallInst *instruction)

{
  Op op;
  bool bVar1;
  TypeID TVar2;
  Id IVar3;
  Builder *pBVar4;
  Value *pVVar5;
  mapped_type *pmVar6;
  Type *pTVar7;
  LoggingCallback p_Var8;
  void *pvVar9;
  mapped_type *pmVar10;
  Operation *pOVar11;
  Operation *this;
  int width;
  Id ptr_id;
  Op value_cast_op;
  Id physical_type_id;
  char buffer [4096];
  Id local_1084;
  RawVecSize local_1080;
  int local_107c;
  Builder *local_1078;
  int local_106c;
  uint local_1068;
  Op local_1064;
  mapped_type *local_1060;
  Type *local_1058;
  Type *local_1050;
  Id local_1048;
  Id local_1044;
  Id local_1040;
  Id local_103c;
  initializer_list<unsigned_int> local_1038;
  char local_1028 [4088];
  
  pBVar4 = Converter::Impl::builder(impl);
  pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  bVar1 = false;
  local_1084 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
  if (local_1084 != 0) {
    if (local_1084 == impl->root_constant_id) {
      bVar1 = emit_cbuffer_load_root_constant(impl,instruction);
      return bVar1;
    }
    pmVar6 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&impl->handle_to_resource_meta,&local_1084);
    pTVar7 = LLVMBC::Value::getType((Value *)instruction);
    TVar2 = LLVMBC::Type::getTypeID(pTVar7);
    if (TVar2 == StructTyID) {
      emit_buffer_synchronization_validation(impl,instruction,Load);
      if (pmVar6->storage == StorageClassShaderRecordBufferKHR) {
        local_1038._M_array =
             (iterator)LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
        pmVar10 = std::__detail::
                  _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&impl->handle_to_root_member_offset,(key_type *)&local_1038);
        bVar1 = emit_cbuffer_load_shader_record(impl,instruction,*pmVar10);
      }
      else {
        if (pmVar6->storage == StorageClassPhysicalStorageBuffer) {
          emit_cbuffer_load_physical_pointer(impl,instruction);
        }
        else {
          local_1078 = pBVar4;
          local_1050 = pTVar7;
          pTVar7 = LLVMBC::Type::getStructElementType(pTVar7,0);
          local_1064 = OpNop;
          local_1048 = 0;
          local_1060 = pmVar6;
          get_physical_load_store_cast_info(impl,pTVar7,&local_1048,&local_1064);
          local_1068 = get_type_scalar_alignment(impl,pTVar7);
          bVar1 = local_1068 != 8;
          local_1080 = (uint)bVar1 * 2 + V2;
          width = (uint)(local_1068 == 8) * 0x20 + 0x20;
          local_107c = (uint)bVar1 * 2 + 2;
          local_1058 = pTVar7;
          TVar2 = LLVMBC::Type::getTypeID(pTVar7);
          local_1084 = get_buffer_alias_handle
                                 (impl,local_1060,local_1084,(uint)(bVar1 || TVar2 != IntegerTyID),
                                  bVar1 ^ B64,local_1080);
          pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
          local_1080 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
          pBVar4 = local_1078;
          if (bVar1 || TVar2 != IntegerTyID) {
            IVar3 = spv::Builder::makeFloatType(local_1078,width);
          }
          else {
            IVar3 = spv::Builder::makeIntegerType(local_1078,width,false);
          }
          local_106c = width;
          IVar3 = spv::Builder::makeVectorType(pBVar4,IVar3,local_107c);
          pmVar6 = local_1060;
          local_1078 = (Builder *)CONCAT44(local_1078._4_4_,IVar3);
          IVar3 = spv::Builder::makePointer(pBVar4,local_1060->storage,IVar3);
          pOVar11 = Converter::Impl::allocate(impl,OpAccessChain,IVar3);
          local_1044 = local_1084;
          IVar3 = spv::Builder::makeIntegerType(pBVar4,0x20,false);
          local_1040 = spv::Builder::makeIntConstant(pBVar4,IVar3,0,false);
          local_103c = local_1080;
          local_1038._M_len = 3;
          local_1038._M_array = &local_1044;
          Operation::add_ids(pOVar11,&local_1038);
          Converter::Impl::add(impl,pOVar11,false);
          if (pmVar6->non_uniform == true) {
            spv::Builder::addDecoration(pBVar4,pOVar11->id,DecorationNonUniform,-1);
          }
          pTVar7 = LLVMBC::Type::getStructElementType(local_1050,0);
          TVar2 = LLVMBC::Type::getTypeID(pTVar7);
          this = Converter::Impl::allocate(impl,OpLoad,(Value *)instruction,(Id)local_1078);
          Operation::add_id(this,pOVar11->id);
          Converter::Impl::add(impl,this,false);
          if (local_1068 == 2) {
            build_bitcast_32x4_to_16x8_composite(impl,instruction,this->id);
          }
          else if ((local_1068 < 8) && (TVar2 == IntegerTyID)) {
            IVar3 = spv::Builder::makeIntegerType(pBVar4,local_106c,false);
            IVar3 = spv::Builder::makeVectorType(pBVar4,IVar3,local_107c);
            pOVar11 = Converter::Impl::allocate(impl,OpBitcast,IVar3);
            Operation::add_id(pOVar11,this->id);
            Converter::Impl::add(impl,pOVar11,false);
            Converter::Impl::rewrite_value(impl,(Value *)instruction,pOVar11->id);
          }
          op = local_1064;
          if (local_1064 != OpNop) {
            IVar3 = Converter::Impl::get_type_id(impl,local_1058,0);
            IVar3 = spv::Builder::makeVectorType(pBVar4,IVar3,local_107c);
            pOVar11 = Converter::Impl::allocate(impl,op,IVar3);
            IVar3 = Converter::Impl::get_id_for_value(impl,(Value *)instruction,0);
            Operation::add_id(pOVar11,IVar3);
            Converter::Impl::add(impl,pOVar11,false);
            Converter::Impl::rewrite_value(impl,(Value *)instruction,pOVar11->id);
          }
          build_exploded_composite_from_vector(impl,&instruction->super_Instruction,4);
        }
        bVar1 = true;
      }
    }
    else {
      p_Var8 = get_thread_log_callback();
      if (p_Var8 == (LoggingCallback)0x0) {
        emit_cbuffer_load_legacy_instruction();
      }
      else {
        builtin_strncpy(local_1028 + 0x10,"ust be struct.\n",0x10);
        builtin_strncpy(local_1028,"y: return type m",0x10);
        local_1038._M_array = (iterator)0x4c72656666754243;
        local_1038._M_len._0_1_ = 'o';
        local_1038._M_len._1_1_ = 'a';
        local_1038._M_len._2_1_ = 'd';
        local_1038._M_len._3_1_ = 'L';
        local_1038._M_len._4_1_ = 'e';
        local_1038._M_len._5_1_ = 'g';
        local_1038._M_len._6_1_ = 'a';
        local_1038._M_len._7_1_ = 'c';
        pvVar9 = get_thread_log_callback_userdata();
        (*p_Var8)(pvVar9,Error,(char *)&local_1038);
      }
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool emit_cbuffer_load_legacy_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	// This function returns a struct, but ignore that, and just return a vec4 for now.
	// extractvalue is used to pull out components and that works for vectors as well.
	spv::Id ptr_id = impl.get_id_for_value(instruction->getOperand(1));
	if (!ptr_id)
		return false;

	if (ptr_id == impl.root_constant_id)
	{
		return emit_cbuffer_load_root_constant(impl, instruction);
	}
	else
	{
		auto &meta = impl.handle_to_resource_meta[ptr_id];

		auto *result_type = instruction->getType();

		if (result_type->getTypeID() != llvm::Type::TypeID::StructTyID)
		{
			LOGE("CBufferLoadLegacy: return type must be struct.\n");
			return false;
		}

		emit_buffer_synchronization_validation(impl, instruction, BDAOperation::Load);

		if (meta.storage == spv::StorageClassPhysicalStorageBuffer)
		{
			return emit_cbuffer_load_physical_pointer(impl, instruction);
		}
		else if (meta.storage == spv::StorageClassShaderRecordBufferKHR)
		{
			return emit_cbuffer_load_shader_record(impl, instruction,
			                                       impl.handle_to_root_member_offset[instruction->getOperand(1)]);
		}

		// Handle min16float where we want FP16 value, but FP32 physical.
		auto *result_component_type = result_type->getStructElementType(0);
		spv::Op value_cast_op = spv::OpNop;
		spv::Id physical_type_id = 0;
		get_physical_load_store_cast_info(impl, result_component_type, physical_type_id, value_cast_op);

		RawVecSize alias_vecsize;
		RawWidth alias_width;
		unsigned scalar_alignment = get_type_scalar_alignment(impl, result_component_type);
		unsigned bits, vecsize;

		if (scalar_alignment == 8)
		{
			alias_width = RawWidth::B64;
			alias_vecsize = RawVecSize::V2;
		}
		else
		{
			alias_width = RawWidth::B32;
			alias_vecsize = RawVecSize::V4;
		}

		bits = raw_width_to_bits(alias_width);
		vecsize = raw_vecsize_to_vecsize(alias_vecsize);

		RawType raw_type = result_component_type->getTypeID() == llvm::Type::TypeID::IntegerTyID &&
		                   scalar_alignment == 8 ? RawType::Integer : RawType::Float;

		ptr_id = get_buffer_alias_handle(impl, meta, ptr_id, raw_type, alias_width, alias_vecsize);

		spv::Id vec4_index = impl.get_id_for_value(instruction->getOperand(2));

		spv::Id element_type_id = raw_type == RawType::Integer ?
		                          builder.makeUintType(bits) : builder.makeFloatType(bits);

		spv::Id vector_type_id = builder.makeVectorType(element_type_id, vecsize);
		Operation *access_chain_op = impl.allocate(spv::OpAccessChain, builder.makePointer(meta.storage, vector_type_id));
		access_chain_op->add_ids({ ptr_id, builder.makeUintConstant(0), vec4_index });
		impl.add(access_chain_op);

		if (meta.non_uniform)
			builder.addDecoration(access_chain_op->id, spv::DecorationNonUniformEXT);

		bool need_bitcast = false;
		if (result_type->getStructElementType(0)->getTypeID() == llvm::Type::TypeID::IntegerTyID && scalar_alignment < 8)
			need_bitcast = true;

		Operation *load_op = impl.allocate(spv::OpLoad, instruction, vector_type_id);
		load_op->add_id(access_chain_op->id);
		impl.add(load_op);

		if (scalar_alignment == 2)
		{
			// Special case, need to bitcast and build a struct with 8 elements instead.
			if (!build_bitcast_32x4_to_16x8_composite(impl, instruction, load_op->id))
				return false;
		}
		else if (need_bitcast)
		{
			spv::Id uint_vector_type_id = builder.makeVectorType(builder.makeUintType(bits), vecsize);
			Operation *op = impl.allocate(spv::OpBitcast, uint_vector_type_id);

			op->add_id(load_op->id);
			impl.add(op);
			impl.rewrite_value(instruction, op->id);
		}

		// If we have min-precision loads, we might have to truncate here.
		if (value_cast_op != spv::OpNop)
		{
			auto *cast_op = impl.allocate(value_cast_op, builder.makeVectorType(impl.get_type_id(result_component_type), vecsize));
			cast_op->add_id(impl.get_id_for_value(instruction));
			impl.add(cast_op);
			impl.rewrite_value(instruction, cast_op->id);
		}

		build_exploded_composite_from_vector(impl, instruction, 4);
	}

	return true;
}